

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O3

void cleanup_object_property(void)

{
  obj_property *poVar1;
  long lVar2;
  ulong uVar3;
  
  if (z_info->property_max != 0) {
    lVar2 = 0xd0;
    uVar3 = 0;
    do {
      poVar1 = obj_properties;
      string_free(*(char **)((long)obj_properties->type_mult + lVar2 + -0x40));
      string_free(*(char **)((long)poVar1->type_mult + lVar2 + -0x38));
      string_free(*(char **)((long)poVar1->type_mult + lVar2 + -0x30));
      string_free(*(char **)((long)poVar1->type_mult + lVar2 + -0x28));
      string_free(*(char **)((long)poVar1->type_mult + lVar2 + -0x20));
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0xf0;
    } while (uVar3 < z_info->property_max);
  }
  mem_free(obj_properties);
  return;
}

Assistant:

static void cleanup_object_property(void)
{
	int idx;
	for (idx = 0; idx < z_info->property_max; idx++) {
		struct obj_property *prop = &obj_properties[idx];

		string_free(prop->name);
		string_free(prop->adjective);
		string_free(prop->neg_adj);
		string_free(prop->msg);
		string_free(prop->desc);
	}
	mem_free(obj_properties);
}